

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O1

void density_tests::heterogeneous_queue_samples(ostream *i_ostream)

{
  ControlBlock *pCVar1;
  pointer pcVar2;
  char *__s;
  ulong uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  runtime_type<> *prVar7;
  undefined8 *puVar8;
  size_t sVar9;
  int *piVar10;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar11;
  void *pvVar12;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar13;
  ControlBlock *pCVar14;
  ostream *poVar15;
  Allocation AVar16;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  string my_string;
  consume_operation consume;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  double pi;
  PrintScopeDuration dur;
  put_transaction<MessageInABottle> local_210;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  put_transaction<MessageInABottle> local_1d8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_1c0;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_1b0;
  reentrant_put_transaction<int> local_1a0;
  undefined8 local_188;
  PrintScopeDuration local_180;
  iterator local_150;
  iterator local_130;
  iterator local_110;
  iterator local_f0;
  iterator local_d0;
  iterator local_b0;
  iterator local_90;
  iterator local_70;
  iterator local_50;
  
  PrintScopeDuration::PrintScopeDuration(&local_180,i_ostream,"heterogeneous queue samples");
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_1f8._0_4_ = 0x13;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_210,(int *)local_1f8);
  local_1f8._0_4_ = 8;
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT71(local_1d8.m_queue._1_7_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_210,(int *)local_1f8,(char *)&local_1d8);
  local_1d8.m_put_data.m_control_block = (ControlBlock *)local_210.m_queue;
  while (local_1d8.m_put_data.m_control_block != local_210.m_put_data.m_control_block) {
    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1d8.m_put_data.m_control_block)->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00aa30bf;
    }
    local_1d8.m_put_data.m_control_block = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  local_1d8.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa30bf:
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &local_210;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::element<int>((consume_operation *)&local_1d8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&local_1d8);
  phVar11 = local_210.m_queue;
  while (phVar11 !=
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         local_210.m_put_data.m_control_block) {
    pCVar1 = phVar11->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      phVar11->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00aa310a;
    }
    phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
LAB_00aa310a:
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&local_1d8);
  }
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &local_210;
  local_1d8.m_put_data.m_control_block = (ControlBlock *)phVar11;
  pbVar5 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           consume_operation::element<std::__cxx11::string>((consume_operation *)&local_1d8);
  pcVar2 = (pbVar5->_M_dataplus)._M_p;
  local_1f8._0_8_ = &local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar2,pcVar2 + pbVar5->_M_string_length);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl(local_1d8.m_queue,local_1d8.m_put_data.m_control_block);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_210);
  local_1a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_1a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<0ul,true,8ul,8ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_1a0);
  local_1f8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
       ::s_table;
  *(undefined8 *)local_1f8._16_8_ = 0;
  local_1f8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &local_1a0;
  local_1d8.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)local_1f8);
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &local_1a0;
  local_210.m_put_data = local_1d8.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction(&local_1d8);
  AVar16 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           inplace_allocate<2ul,false>
                     ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                       *)&local_1a0,0xd,1);
  pvVar12 = AVar16.m_user_storage;
  lVar6 = 0;
  do {
    *(char *)((long)pvVar12 + lVar6) = "Hello world!"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  if ((reentrant_put_transaction<int> *)local_210.m_queue == (reentrant_put_transaction<int> *)0x0)
  {
    detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x2f7);
    *(void **)local_210.m_put_data.m_user_storage = pvVar12;
    detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x2c2);
  }
  else {
    *(void **)local_210.m_put_data.m_user_storage = pvVar12;
  }
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_1d8.m_put_data.m_control_block = (ControlBlock *)local_1a0.m_queue;
  while (local_1d8.m_put_data.m_control_block != local_1a0.m_put_data.m_control_block) {
    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1d8.m_put_data.m_control_block)->m_head;
    if (((ulong)pCVar1 & 3) == 0) {
      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block)->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
      goto LAB_00aa32ab;
    }
    local_1d8.m_put_data.m_control_block = (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
  }
  local_1d8.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa32ab:
  local_1d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &local_1a0;
  prVar7 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)&local_1d8);
  if (prVar7->m_feature_table ==
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
      ::s_table) {
    pbVar5 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
             ::consume_operation::element<std::__cxx11::string>((consume_operation *)&local_1d8);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  else {
    prVar7 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)&local_1d8);
    if (prVar7->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
        ::s_table) goto LAB_00aa33ba;
    if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_1d8.m_put_data.m_control_block ==
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
LAB_00aa32f2:
      detail::assert_failed<>
                ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0x415);
    }
    else {
      prVar7 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type((consume_operation *)&local_1d8);
      if (prVar7->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
          ::s_table) goto LAB_00aa32f2;
    }
    puVar8 = (undefined8 *)
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             get_element(local_1d8.m_put_data.m_control_block);
    __s = (char *)*puVar8;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107b148);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar9);
    }
    poVar15 = (ostream *)&std::cout;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  }
  std::ostream::put((char)poVar15);
  std::ostream::flush();
LAB_00aa33ba:
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&local_1d8);
  local_1c0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_1c0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_1b0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_1b0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_1f8._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_1c0,(int *)local_1f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            ((iterator *)local_1f8,&local_1c0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1f8._0_8_ !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    do {
      if ((undefined1 *)local_1e8._8_8_ !=
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("m_type.template is<TYPE>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/dynamic_reference.h"
                      ,0x102,
                      "add_cv_qual_t<TYPE, CV_QUALIFIER> &density::dynamic_reference<>::as() const [RUNTIME_TYPE = density::runtime_type<>, CV_QUALIFIER = density::cv_qual::no_qual, TYPE = int]"
                     );
      }
      if (*(int *)local_1e8._M_allocated_capacity != 0x2a) {
        __assert_fail("value.as<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x58f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      iterator::operator++((iterator *)local_1f8);
    } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1f8._0_8_ !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0
            );
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_1b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_1c0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cancel_consume_impl(local_1d8.m_queue,local_1d8.m_put_data.m_control_block);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction(&local_210);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_1a0);
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_50,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_210);
  local_1f8._0_8_ = local_50.m_control;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_50.m_control !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    do {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      iterator::operator++((iterator *)local_1f8);
    } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1f8._0_8_ !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0
            );
    if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_50.m_control !=
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
      __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x598,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            ((const_iterator *)local_1f8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_210);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1f8._0_8_ !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x599,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_210);
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  stack0xfffffffffffffe10 = (unkuint9)0;
  local_1f8._0_8_ = &local_1e8;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&local_210,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  local_1f8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       0x4010000000000000;
  local_1f8._8_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&local_210,(pair<double,_int> *)local_1f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_1f8,
                (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_210);
  bVar4 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&local_210,
                       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)local_1f8);
  if (!bVar4) {
    __assert_fail("queue == queue_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5ab,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)local_1f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&local_210);
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  stack0xfffffffffffffe10 = (unkuint9)0;
  local_1f8._0_8_ = &local_1e8;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&local_210,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  local_1f8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       0x4010000000000000;
  local_1f8._8_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&local_210,(pair<double,_int> *)local_1f8);
  local_1d8.m_queue = local_210.m_queue;
  local_1d8.m_put_data.m_control_block = local_210.m_put_data.m_control_block;
  local_210.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_70,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&local_210);
  local_1f8._0_8_ = local_70.m_control;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_70.m_control !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    do {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::iterator::operator++((iterator *)local_1f8);
    } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1f8._0_8_ !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0
            );
    if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_70.m_control !=
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
      __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x5bf,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin((const_iterator *)local_1f8,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)&local_210);
  phVar11 = local_1d8.m_queue;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1f8._0_8_ !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c0,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  do {
    phVar13 = phVar11;
    if (phVar13 ==
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_1d8.m_put_data.m_control_block) goto LAB_00aa469f;
    phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ((ulong)phVar13->m_head & 0xfffffffffffffff8);
  } while (((ulong)phVar13->m_head & 3) != 0);
  if (phVar13 ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_1d8.m_put_data.m_control_block) {
LAB_00aa469f:
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c2,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_90,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&local_1d8);
  local_1f8._0_8_ = local_90.m_control;
  local_1f8._8_8_ = local_90.m_queue;
  local_1f8._8_8_ = local_90.m_queue;
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_90.m_control !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    lVar6 = 2;
    do {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::iterator::operator++((iterator *)local_1f8);
      lVar6 = lVar6 + -1;
    } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_1f8._0_8_ !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0
            );
    if (lVar6 == 0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::cbegin((const_iterator *)local_1f8,
               (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                *)&local_1d8);
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_1f8._0_8_ ==
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        __assert_fail("queue_1.cbegin() != queue_1.cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x5c4,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_1d8);
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_210);
      local_1f8._0_8_ = &DAT_0000ffef;
      local_1f8._8_8_ = &DAT_0000ffef;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1f8);
      local_1f8._0_8_ = &DAT_0000ffef;
      local_1f8._8_8_ = &DAT_0000ffef;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1f8);
      local_210.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
      stack0xfffffffffffffe10 = (unkuint9)0;
      local_1f8._0_8_ = &local_1e8;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
      ::emplace<std::__cxx11::string,std::__cxx11::string>
                ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
                  *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ != &local_1e8) {
        operator_delete((void *)local_1f8._0_8_);
      }
      local_1f8._0_8_ =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           0x4010000000000000;
      local_1f8._8_4_ = 1;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
      ::emplace<std::pair<double,int>,std::pair<double,int>>
                ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
                  *)&local_210,(pair<double,_int> *)local_1f8);
      local_1d8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_1d8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                     *)local_1f8,
                    (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                     *)&local_210);
      pCVar1 = local_1d8.m_put_data.m_control_block;
      phVar11 = local_1d8.m_queue;
      local_1d8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_1f8._0_8_;
      local_1d8.m_put_data.m_control_block = (ControlBlock *)local_1f8._8_8_;
      local_1f8._0_8_ = phVar11;
      local_1f8._8_8_ = pCVar1;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_1f8);
      bVar4 = density::
              heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
              ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                            *)&local_210,
                           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                            *)&local_1d8);
      if (!bVar4) {
        __assert_fail("queue == queue_1",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x5e5,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_1d8);
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_210);
      local_210.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
      stack0xfffffffffffffe10 = (unkuint9)0;
      local_1f8._0_8_ = &local_1e8;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
      ::emplace<std::__cxx11::string,std::__cxx11::string>
                ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
                  *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ != &local_1e8) {
        operator_delete((void *)local_1f8._0_8_);
      }
      local_1f8._0_8_ =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           0x4010000000000000;
      local_1f8._8_4_ = 1;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
      ::emplace<std::pair<double,int>,std::pair<double,int>>
                ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
                  *)&local_210,(pair<double,_int> *)local_1f8);
      local_1d8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_1d8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&local_1d8);
      local_1d8.m_queue = local_210.m_queue;
      local_1d8.m_put_data.m_control_block = local_210.m_put_data.m_control_block;
      local_210.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &DAT_0000ffef;
      local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::begin(&local_b0,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&local_210);
      local_1f8._0_8_ = local_b0.m_control;
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_b0.m_control !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        do {
          density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::iterator::operator++((iterator *)local_1f8);
        } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_1f8._0_8_ !=
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0);
        if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_b0.m_control !=
            (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0)
        {
          __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x5fa,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
      }
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::cbegin((const_iterator *)local_1f8,
               (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                *)&local_210);
      phVar11 = local_1d8.m_queue;
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_1f8._0_8_ !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        __assert_fail("queue.cbegin() == queue.cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x5fb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      do {
        phVar13 = phVar11;
        if (phVar13 ==
            (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_1d8.m_put_data.m_control_block) goto LAB_00aa46be;
        phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)((ulong)phVar13->m_head & 0xfffffffffffffff8);
      } while (((ulong)phVar13->m_head & 3) != 0);
      if (phVar13 ==
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_1d8.m_put_data.m_control_block) {
LAB_00aa46be:
        __assert_fail("!queue_1.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x5fd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
      ::begin(&local_d0,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&local_1d8);
      local_1f8._0_8_ = local_d0.m_control;
      local_1f8._8_8_ = local_d0.m_queue;
      local_1f8._8_8_ = local_d0.m_queue;
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_d0.m_control !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        lVar6 = 2;
        do {
          density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::iterator::operator++((iterator *)local_1f8);
          lVar6 = lVar6 + -1;
        } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_1f8._0_8_ !=
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0);
        if (lVar6 == 0) {
          density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::cbegin((const_iterator *)local_1f8,
                   (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                    *)&local_1d8);
          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1f8._0_8_ ==
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              0x0) {
            __assert_fail("queue_1.cbegin() != queue_1.cend()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x5ff,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
          density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                     *)&local_1d8);
          density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                     *)&local_210);
          local_1f8._0_8_ = &DAT_0000ffef;
          local_1f8._8_8_ = &DAT_0000ffef;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_1f8);
          local_1f8._0_8_ = &DAT_0000ffef;
          local_1f8._8_8_ = &DAT_0000ffef;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_1f8);
          local_1f8._0_8_ = &DAT_0000ffef;
          local_1f8._8_8_ = &DAT_0000ffef;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_1f8);
          local_210.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &DAT_0000ffef;
          local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
          local_1d8.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &DAT_0000ffef;
          local_1d8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
          local_1f8._0_4_ = 1;
          density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
          emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                            *)&local_210,(int *)local_1f8);
          pCVar1 = local_1d8.m_put_data.m_control_block;
          phVar13 = local_1d8.m_queue;
          phVar11 = local_210.m_queue;
          local_210.m_queue = local_1d8.m_queue;
          local_1d8.m_queue = phVar11;
          local_1d8.m_put_data.m_control_block = local_210.m_put_data.m_control_block;
          local_210.m_put_data.m_control_block = pCVar1;
          do {
            phVar11 = phVar13;
            if (phVar11 ==
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                pCVar1) goto LAB_00aa3a42;
            phVar13 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)((ulong)phVar11->m_head & 0xfffffffffffffff8);
          } while (((ulong)phVar11->m_head & 3) != 0);
          if (phVar11 !=
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              pCVar1) {
            __assert_fail("queue.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x61c,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
LAB_00aa3a42:
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::begin(&local_f0,
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_210);
          local_1f8._0_8_ = local_f0.m_control;
          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_f0.m_control !=
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              0x0) {
            do {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              iterator::operator++((iterator *)local_1f8);
            } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)local_1f8._0_8_ !=
                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)0x0);
            if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_f0.m_control !=
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
              __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x61d,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
          }
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::cbegin((const_iterator *)local_1f8,
                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&local_210);
          phVar11 = local_1d8.m_queue;
          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1f8._0_8_ !=
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              0x0) {
            __assert_fail("queue.cbegin() == queue.cend()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x61e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
          do {
            phVar13 = phVar11;
            if (phVar13 ==
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_1d8.m_put_data.m_control_block) goto LAB_00aa46dd;
            phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)((ulong)phVar13->m_head & 0xfffffffffffffff8);
          } while (((ulong)phVar13->m_head & 3) != 0);
          if (phVar13 ==
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1d8.m_put_data.m_control_block) {
LAB_00aa46dd:
            __assert_fail("!queue_1.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x620,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::begin(&local_110,
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_1d8);
          local_1f8._0_8_ = local_110.m_control;
          local_1f8._8_8_ = local_110.m_queue;
          local_1f8._8_8_ = local_110.m_queue;
          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_110.m_control !=
              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              0x0) {
            lVar6 = 1;
            do {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              iterator::operator++((iterator *)local_1f8);
              lVar6 = lVar6 + -1;
            } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)local_1f8._0_8_ !=
                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)0x0);
            if (lVar6 == 0) {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              cbegin((const_iterator *)local_1f8,
                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)&local_1d8);
              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_1f8._0_8_ ==
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0) {
                __assert_fail("queue_1.cbegin() != queue_1.cend()",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x622,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_1d8);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_210);
              local_210.m_queue =
                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&DAT_0000ffef;
              local_210.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
              local_1d8.m_queue =
                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&DAT_0000ffef;
              local_1d8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
              local_1f8._0_4_ = 1;
              density::
              heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
              emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&local_210,(int *)local_1f8);
              pCVar1 = local_1d8.m_put_data.m_control_block;
              phVar13 = local_1d8.m_queue;
              phVar11 = local_210.m_queue;
              local_210.m_queue = local_1d8.m_queue;
              local_1d8.m_queue = phVar11;
              local_1d8.m_put_data.m_control_block = local_210.m_put_data.m_control_block;
              local_210.m_put_data.m_control_block = pCVar1;
              do {
                phVar11 = phVar13;
                if (phVar11 ==
                    (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)pCVar1) goto LAB_00aa3bd1;
                phVar13 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)((ulong)phVar11->m_head & 0xfffffffffffffff8);
              } while (((ulong)phVar11->m_head & 3) != 0);
              if (phVar11 !=
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)pCVar1) {
                __assert_fail("queue.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x62d,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
LAB_00aa3bd1:
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              begin(&local_130,
                    (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_210);
              local_1f8._0_8_ = local_130.m_control;
              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_130.m_control !=
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0) {
                do {
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  iterator::operator++((iterator *)local_1f8);
                } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)local_1f8._0_8_ !=
                         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)0x0);
                if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_130.m_control !=
                    (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)0x0) {
                  __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                ,0x62e,
                                "void density_tests::heterogeneous_queue_samples(std::ostream &)");
                }
              }
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              cbegin((const_iterator *)local_1f8,
                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)&local_210);
              phVar11 = local_1d8.m_queue;
              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_1f8._0_8_ !=
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0) {
                __assert_fail("queue.cbegin() == queue.cend()",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x62f,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              do {
                phVar13 = phVar11;
                if (phVar13 ==
                    (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_1d8.m_put_data.m_control_block) goto LAB_00aa46fc;
                phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)((ulong)phVar13->m_head & 0xfffffffffffffff8);
              } while (((ulong)phVar13->m_head & 3) != 0);
              if (phVar13 ==
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_1d8.m_put_data.m_control_block) {
LAB_00aa46fc:
                __assert_fail("!queue_1.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x631,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              begin(&local_150,
                    (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_1d8);
              local_1f8._0_8_ = local_150.m_control;
              local_1f8._8_8_ = local_150.m_queue;
              local_1f8._8_8_ = local_150.m_queue;
              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_150.m_control !=
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)0x0) {
                lVar6 = 1;
                do {
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  iterator::operator++((iterator *)local_1f8);
                  lVar6 = lVar6 + -1;
                } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)local_1f8._0_8_ !=
                         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)0x0);
                if (lVar6 == 0) {
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  cbegin((const_iterator *)local_1f8,
                         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)&local_1d8);
                  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_1f8._0_8_ ==
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)0x0) {
                    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x633,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&local_1d8);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&local_210);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = &DAT_0000ffef;
                  local_210.m_queue._0_4_ = 1;
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)local_1f8._0_8_;
                  do {
                    phVar13 = phVar11;
                    if (phVar13 ==
                        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_1f8._8_8_) goto LAB_00aa471b;
                    phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)((ulong)phVar13->m_head & 0xfffffffffffffff8);
                  } while (((ulong)phVar13->m_head & 3) != 0);
                  if (phVar13 ==
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_1f8._8_8_) {
LAB_00aa471b:
                    __assert_fail("!queue.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x63b,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = &DAT_0000ffef;
                  local_210.m_queue._0_4_ = 1;
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  clear((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_1f8);
                  phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)local_1f8._0_8_;
                  do {
                    phVar13 = phVar11;
                    if (phVar13 ==
                        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_1f8._8_8_) goto LAB_00aa3dad;
                    phVar11 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)((ulong)phVar13->m_head & 0xfffffffffffffff8);
                  } while (((ulong)phVar13->m_head & 3) != 0);
                  if (phVar13 !=
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_1f8._8_8_) {
                    __assert_fail("queue.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x643,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
LAB_00aa3dad:
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                  local_210.m_queue._0_4_ = 1;
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)CONCAT44(local_210.m_queue._4_4_,2);
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_1f8);
                  local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                  while (local_210.m_put_data.m_control_block != (ControlBlock *)local_1f8._8_8_) {
                    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_210.m_put_data.m_control_block)->m_head;
                    if (((ulong)pCVar1 & 3) == 0) {
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_210.m_put_data.m_control_block)->m_head =
                           (ControlBlock *)((ulong)pCVar1 | 1);
                      goto LAB_00aa3e28;
                    }
                    local_210.m_put_data.m_control_block =
                         (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                  }
                  local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa3e28:
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_1f8;
                  piVar10 = density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::consume_operation::element<int>((consume_operation *)&local_210);
                  if (*piVar10 != 2) {
                    __assert_fail("consume.element<int>() == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x64e,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  consume_operation::commit((consume_operation *)&local_210);
                  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_210.m_put_data.m_control_block !=
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)0x0) {
                    density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::cancel_consume_impl(local_210.m_queue,local_210.m_put_data.m_control_block);
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                  bVar4 = density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_1f8);
                  if (bVar4) {
                    __assert_fail("pop_result == false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x657,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  local_210.m_queue._0_4_ = 1;
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)CONCAT44(local_210.m_queue._4_4_,2);
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  bVar4 = density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_1f8);
                  if (!bVar4) {
                    __assert_fail("pop_result == true",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x65d,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                  while (local_210.m_put_data.m_control_block != (ControlBlock *)local_1f8._8_8_) {
                    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_210.m_put_data.m_control_block)->m_head;
                    if (((ulong)pCVar1 & 3) == 0) {
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_210.m_put_data.m_control_block)->m_head =
                           (ControlBlock *)((ulong)pCVar1 | 1);
                      goto LAB_00aa3efa;
                    }
                    local_210.m_put_data.m_control_block =
                         (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                  }
                  local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa3efa:
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_1f8;
                  piVar10 = density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::consume_operation::element<int>((consume_operation *)&local_210);
                  if (*piVar10 != 2) {
                    __assert_fail("consume.element<int>() == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x65f,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  consume_operation::commit((consume_operation *)&local_210);
                  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_210.m_put_data.m_control_block !=
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)0x0) {
                    density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::cancel_consume_impl(local_210.m_queue,local_210.m_put_data.m_control_block);
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)CONCAT44(local_210.m_queue._4_4_,0x2a);
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_210);
                  local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                  while (local_210.m_put_data.m_control_block != (ControlBlock *)local_1f8._8_8_) {
                    pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_210.m_put_data.m_control_block)->m_head;
                    if (((ulong)pCVar1 & 3) == 0) {
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_210.m_put_data.m_control_block)->m_head =
                           (ControlBlock *)((ulong)pCVar1 | 1);
                      goto LAB_00aa3f93;
                    }
                    local_210.m_put_data.m_control_block =
                         (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                  }
                  local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa3f93:
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_1f8;
                  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_210.m_put_data.m_control_block ==
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)0x0) {
                    __assert_fail("consume_2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x66e,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  piVar10 = density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::consume_operation::element<int>((consume_operation *)&local_210);
                  if (*piVar10 != 0x2a) {
                    __assert_fail("consume_2.element<int>() == 42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x66f,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  consume_operation::commit((consume_operation *)&local_210);
                  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_210.m_put_data.m_control_block !=
                      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)0x0) {
                    density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::cancel_consume_impl(local_210.m_queue,local_210.m_put_data.m_control_block);
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1f8._0_8_ = &DAT_0000ffef;
                  local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                  local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
                  bVar4 = density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::consume_operation::start_consume_impl
                                    ((consume_operation *)&local_210,0,
                                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                      *)local_1f8);
                  if ((bVar4) || (local_210.m_put_data.m_control_block != (ControlBlock *)0x0)) {
                    __assert_fail("!bool_1 && !consume_1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x679,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  local_1d8.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)CONCAT44(local_1d8.m_queue._4_4_,0x2a);
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                    *)local_1f8,(int *)&local_1d8);
                  local_1d8.m_put_data.m_control_block = (ControlBlock *)0x0;
                  bVar4 = density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::consume_operation::start_consume_impl
                                    ((consume_operation *)&local_1d8,0,
                                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                      *)local_1f8);
                  if ((!bVar4) || (local_1d8.m_put_data.m_control_block == (ControlBlock *)0x0)) {
                    __assert_fail("consume_2 && bool_2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x67f,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  piVar10 = density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::consume_operation::element<int>((consume_operation *)&local_1d8);
                  if (*piVar10 != 0x2a) {
                    __assert_fail("consume_2.element<int>() == 42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x680,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  consume_operation::commit((consume_operation *)&local_1d8);
                  if (local_1d8.m_put_data.m_control_block != (ControlBlock *)0x0) {
                    density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::cancel_consume_impl(local_1d8.m_queue,local_1d8.m_put_data.m_control_block);
                  }
                  if (local_210.m_put_data.m_control_block != (ControlBlock *)0x0) {
                    density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::cancel_consume_impl(local_210.m_queue,local_210.m_put_data.m_control_block);
                  }
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_1f8);
                  local_1c0.m_head = (ControlBlock *)&DAT_0000ffef;
                  local_1c0.m_tail = (ControlBlock *)&DAT_0000ffef;
                  join_0x00000010_0x00000000_ =
                       density::
                       heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                       ::inplace_allocate<1ul,true,4ul,4ul>
                                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                   *)&local_1c0);
                  local_1f8._8_8_[1].m_next =
                       (uintptr_t)
                       density::detail::
                       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                       ::s_table;
                  *(undefined4 *)local_1f8._16_8_ = 1;
                  local_1f8._0_8_ =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
                  local_210.m_queue = &local_1c0;
                  local_210.m_put_data = join_0x00000010_0x00000000_;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::~reentrant_put_transaction
                            ((reentrant_put_transaction<int> *)local_1f8);
                  local_1a0.m_queue = local_210.m_queue;
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
                  local_1a0.m_put_data = local_210.m_put_data;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::~reentrant_put_transaction
                            ((reentrant_put_transaction<int> *)&local_210);
                  local_1d8.m_queue = local_1a0.m_queue;
                  local_1a0.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
                  local_1d8.m_put_data = local_1a0.m_put_data;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_1a0);
                  density::
                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                  start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
                            ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_210,
                             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                              *)&local_1c0,(char (*) [13])"Hello world!");
                  local_1f8._0_8_ = local_210.m_queue;
                  stack0xfffffffffffffe10 = local_210.m_put_data;
                  local_210.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~reentrant_put_transaction
                            ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_210);
                  local_188 = 0x40091eb851eb851f;
                  local_1b0.m_head =
                       (ControlBlock *)
                       density::detail::
                       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,double>
                       ::s_table;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  start_reentrant_dyn_push_copy
                            ((reentrant_put_transaction<void> *)&local_1a0,&local_1c0,
                             (runtime_type<> *)&local_1b0,&local_188);
                  local_210.m_queue = local_1a0.m_queue;
                  local_1a0.m_queue =
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)0x0;
                  local_210.m_put_data = local_1a0.m_put_data;
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<void>::~reentrant_put_transaction
                            ((reentrant_put_transaction<void> *)&local_1a0);
                  pCVar1 = local_1c0.m_head;
                  do {
                    pCVar14 = pCVar1;
                    if (pCVar14 == local_1c0.m_tail) goto LAB_00aa4205;
                    pCVar1 = (ControlBlock *)(pCVar14->m_next & 0xfffffffffffffff8);
                  } while ((pCVar14->m_next & 3) != 0);
                  if (pCVar14 != local_1c0.m_tail) {
                    __assert_fail("queue.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                  ,0x690,
                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)")
                    ;
                  }
LAB_00aa4205:
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::commit((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1f8);
                  local_1a0.m_put_data.m_control_block = local_1c0.m_head;
                  while (local_1a0.m_put_data.m_control_block != local_1c0.m_tail) {
                    uVar3 = (local_1a0.m_put_data.m_control_block)->m_next;
                    if ((uVar3 & 3) == 0) {
                      (local_1a0.m_put_data.m_control_block)->m_next = uVar3 | 1;
                      goto LAB_00aa423d;
                    }
                    local_1a0.m_put_data.m_control_block =
                         (ControlBlock *)(uVar3 & 0xfffffffffffffff8);
                  }
                  local_1a0.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa423d:
                  local_1a0.m_queue = &local_1c0;
                  if (local_1a0.m_put_data.m_control_block != (ControlBlock *)0x0) {
                    prVar7 = density::
                             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             ::reentrant_consume_operation::complete_type
                                       ((reentrant_consume_operation *)&local_1a0);
                    if (prVar7->m_feature_table ==
                        (tuple_type *)
                        density::detail::
                        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
                        ::s_table) {
                      density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::reentrant_put_transaction<int>::commit
                                ((reentrant_put_transaction<int> *)&local_1d8);
                      local_1b0.m_tail = local_1c0.m_head;
                      while (local_1b0.m_tail != local_1c0.m_tail) {
                        uVar3 = (local_1b0.m_tail)->m_next;
                        if ((uVar3 & 3) == 0) {
                          (local_1b0.m_tail)->m_next = uVar3 | 1;
                          goto LAB_00aa429e;
                        }
                        local_1b0.m_tail = (ControlBlock *)(uVar3 & 0xfffffffffffffff8);
                      }
                      local_1b0.m_tail = (ControlBlock *)0x0;
LAB_00aa429e:
                      local_1b0.m_head = (ControlBlock *)&local_1c0;
                      if (local_1b0.m_tail != (ControlBlock *)0x0) {
                        prVar7 = density::
                                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                 ::reentrant_consume_operation::complete_type
                                           ((reentrant_consume_operation *)&local_1b0);
                        if (prVar7->m_feature_table ==
                            (tuple_type *)
                            density::detail::
                            FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                            ::s_table) {
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<void>::cancel
                                    ((reentrant_put_transaction<void> *)&local_210);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_consume_operation::commit
                                    ((reentrant_consume_operation *)&local_1b0);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_consume_operation::commit
                                    ((reentrant_consume_operation *)&local_1a0);
                          pCVar1 = local_1c0.m_head;
                          do {
                            pCVar14 = pCVar1;
                            if (pCVar14 == local_1c0.m_tail) goto LAB_00aa4311;
                            pCVar1 = (ControlBlock *)(pCVar14->m_next & 0xfffffffffffffff8);
                          } while ((pCVar14->m_next & 3) != 0);
                          if (pCVar14 != local_1c0.m_tail) {
                            __assert_fail("queue.empty()",
                                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                          ,0x6a0,
                                          "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                         );
                          }
LAB_00aa4311:
                          if (local_1b0.m_tail != (ControlBlock *)0x0) {
                            density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::cancel_consume_impl
                                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                        *)local_1b0.m_head,local_1b0.m_tail);
                          }
                          if (local_1a0.m_put_data.m_control_block != (ControlBlock *)0x0) {
                            density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::cancel_consume_impl
                                      (local_1a0.m_queue,local_1a0.m_put_data.m_control_block);
                          }
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                                    ((reentrant_put_transaction<void> *)&local_210);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::
                          reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~reentrant_put_transaction
                                    ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1f8);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<int>::~reentrant_put_transaction
                                    ((reentrant_put_transaction<int> *)&local_1d8);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::destroy(&local_1c0);
                          local_1f8._0_8_ = &DAT_0000ffef;
                          local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                          local_210.m_queue._0_4_ = 1;
                          density::
                          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                          ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                              *)local_1f8,(int *)&local_210);
                          local_210.m_queue =
                               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)CONCAT44(local_210.m_queue._4_4_,2);
                          density::
                          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                          ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                              *)local_1f8,(int *)&local_210);
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                           *)local_1f8);
                          local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                          while (local_210.m_put_data.m_control_block !=
                                 (ControlBlock *)local_1f8._8_8_) {
                            pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)local_210.m_put_data.m_control_block)->m_head;
                            if (((ulong)pCVar1 & 3) == 0) {
                              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)local_210.m_put_data.m_control_block)->m_head =
                                   (ControlBlock *)((ulong)pCVar1 | 1);
                              goto LAB_00aa43d8;
                            }
                            local_210.m_put_data.m_control_block =
                                 (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                          }
                          local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa43d8:
                          local_210.m_queue =
                               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)local_1f8;
                          piVar10 = density::
                                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    ::consume_operation::element<int>
                                              ((consume_operation *)&local_210);
                          if (*piVar10 != 2) {
                            __assert_fail("consume.element<int>() == 2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                          ,0x6ac,
                                          "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                         );
                          }
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::consume_operation::commit((consume_operation *)&local_210);
                          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_210.m_put_data.m_control_block !=
                              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)0x0) {
                            density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::cancel_consume_impl
                                      (local_210.m_queue,local_210.m_put_data.m_control_block);
                          }
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_1f8);
                          local_1f8._0_8_ = &DAT_0000ffef;
                          local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                          bVar4 = density::
                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  ::try_reentrant_pop((
                                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                                  *)local_1f8);
                          if (bVar4) {
                            __assert_fail("pop_result == false",
                                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                          ,0x6b5,
                                          "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                         );
                          }
                          local_210.m_queue._0_4_ = 1;
                          density::
                          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                          ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                              *)local_1f8,(int *)&local_210);
                          local_210.m_queue =
                               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)CONCAT44(local_210.m_queue._4_4_,2);
                          density::
                          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                          ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                              *)local_1f8,(int *)&local_210);
                          bVar4 = density::
                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  ::try_reentrant_pop((
                                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                                  *)local_1f8);
                          if (!bVar4) {
                            __assert_fail("pop_result == true",
                                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                          ,0x6bb,
                                          "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                         );
                          }
                          local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                          while (local_210.m_put_data.m_control_block !=
                                 (ControlBlock *)local_1f8._8_8_) {
                            pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)local_210.m_put_data.m_control_block)->m_head;
                            if (((ulong)pCVar1 & 3) == 0) {
                              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)local_210.m_put_data.m_control_block)->m_head =
                                   (ControlBlock *)((ulong)pCVar1 | 1);
                              goto LAB_00aa44aa;
                            }
                            local_210.m_put_data.m_control_block =
                                 (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                          }
                          local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa44aa:
                          local_210.m_queue =
                               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)local_1f8;
                          piVar10 = density::
                                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    ::reentrant_consume_operation::element<int>
                                              ((reentrant_consume_operation *)&local_210);
                          if (*piVar10 != 2) {
                            __assert_fail("consume.element<int>() == 2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                          ,0x6bd,
                                          "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                         );
                          }
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_consume_operation::commit
                                    ((reentrant_consume_operation *)&local_210);
                          if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_210.m_put_data.m_control_block !=
                              (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)0x0) {
                            density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::cancel_consume_impl
                                      (local_210.m_queue,local_210.m_put_data.m_control_block);
                          }
                          density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_1f8);
                          local_1f8._0_8_ = &DAT_0000ffef;
                          local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                          local_210.m_queue =
                               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)CONCAT44(local_210.m_queue._4_4_,0x2a);
                          density::
                          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                          ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                              *)local_1f8,(int *)&local_210);
                          local_210.m_put_data.m_control_block = (ControlBlock *)local_1f8._0_8_;
                          do {
                            if (local_210.m_put_data.m_control_block ==
                                (ControlBlock *)local_1f8._8_8_) {
                              local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
LAB_00aa4543:
                              local_210.m_queue =
                                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    *)local_1f8;
                              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                   *)local_210.m_put_data.m_control_block ==
                                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                   *)0x0) {
                                __assert_fail("consume_2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                              ,0x6cc,
                                              "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                             );
                              }
                              piVar10 = density::
                                        heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                        ::reentrant_consume_operation::element<int>
                                                  ((reentrant_consume_operation *)&local_210);
                              if (*piVar10 != 0x2a) {
                                __assert_fail("consume_2.element<int>() == 42",
                                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                              ,0x6cd,
                                              "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                             );
                              }
                              density::
                              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                              ::reentrant_consume_operation::commit
                                        ((reentrant_consume_operation *)&local_210);
                              if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                   *)local_210.m_put_data.m_control_block !=
                                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                   *)0x0) {
                                density::
                                heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                ::cancel_consume_impl
                                          (local_210.m_queue,local_210.m_put_data.m_control_block);
                              }
                              density::
                              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                              ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                         *)local_1f8);
                              local_1f8._0_8_ = &DAT_0000ffef;
                              local_1f8._8_8_ = (ControlBlock *)&DAT_0000ffef;
                              local_210.m_put_data.m_control_block = (ControlBlock *)0x0;
                              bVar4 = density::
                                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                      ::reentrant_consume_operation::start_consume_impl
                                                ((reentrant_consume_operation *)&local_210,0,
                                                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                                  *)local_1f8);
                              if ((!bVar4) &&
                                 (local_210.m_put_data.m_control_block == (ControlBlock *)0x0)) {
                                local_1d8.m_queue =
                                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                      *)CONCAT44(local_1d8.m_queue._4_4_,0x2a);
                                density::
                                heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                ::emplace<int,int>((
                                                  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                                  *)local_1f8,(int *)&local_1d8);
                                local_1d8.m_put_data.m_control_block = (ControlBlock *)0x0;
                                bVar4 = density::
                                        heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                        ::reentrant_consume_operation::start_consume_impl
                                                  ((reentrant_consume_operation *)&local_1d8,0,
                                                   (
                                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                                  *)local_1f8);
                                if ((bVar4) &&
                                   (local_1d8.m_put_data.m_control_block != (ControlBlock *)0x0)) {
                                  piVar10 = density::
                                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                            ::reentrant_consume_operation::element<int>
                                                      ((reentrant_consume_operation *)&local_1d8);
                                  if (*piVar10 != 0x2a) {
                                    __assert_fail("consume_2.element<int>() == 42",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                                  ,0x6de,
                                                  "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                                 );
                                  }
                                  density::
                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  ::reentrant_consume_operation::commit
                                            ((reentrant_consume_operation *)&local_1d8);
                                  if (local_1d8.m_put_data.m_control_block != (ControlBlock *)0x0) {
                                    density::
                                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    ::cancel_consume_impl
                                              (local_1d8.m_queue,
                                               local_1d8.m_put_data.m_control_block);
                                  }
                                  if (local_210.m_put_data.m_control_block != (ControlBlock *)0x0) {
                                    density::
                                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    ::cancel_consume_impl
                                              (local_210.m_queue,
                                               local_210.m_put_data.m_control_block);
                                  }
                                  density::
                                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                             *)local_1f8);
                                  heterogeneous_queue_put_samples();
                                  heterogeneous_queue_put_transaction_samples();
                                  heterogeneous_queue_consume_operation_samples();
                                  heterogeneous_queue_reentrant_put_samples();
                                  heterogeneous_queue_reentrant_put_transaction_samples();
                                  heterogeneous_queue_reentrant_consume_operation_samples();
                                  PrintScopeDuration::~PrintScopeDuration(&local_180);
                                  return;
                                }
                                __assert_fail("consume_2 && bool_2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                              ,0x6dd,
                                              "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                             );
                              }
                              __assert_fail("!bool_1 && !consume_1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                            ,0x6d7,
                                            "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                           );
                            }
                            pCVar1 = ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)local_210.m_put_data.m_control_block)->m_head;
                            if (((ulong)pCVar1 & 3) == 0) {
                              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)local_210.m_put_data.m_control_block)->m_head =
                                   (ControlBlock *)((ulong)pCVar1 | 1);
                              goto LAB_00aa4543;
                            }
                            local_210.m_put_data.m_control_block =
                                 (ControlBlock *)((ulong)pCVar1 & 0xfffffffffffffff8);
                          } while( true );
                        }
                      }
                      __assert_fail("!consume1.empty() && consume1.complete_type().is<int>()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                    ,0x69a,
                                    "void density_tests::heterogeneous_queue_samples(std::ostream &)"
                                   );
                    }
                  }
                  __assert_fail("!consume2.empty() && consume2.complete_type().is<std::string>()",
                                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                                ,0x695,
                                "void density_tests::heterogeneous_queue_samples(std::ostream &)");
                }
              }
              __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x632,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
          }
          __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x621,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
      }
      __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x5fe,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
  }
  __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x5c3,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
}

Assistant:

void heterogeneous_queue_samples(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "heterogeneous queue samples");

        using namespace density;

        {
            //! [heter_queue put example 1]
            heter_queue<> queue;
            queue.push(19);                     // the parameter can be an l-value or an r-value
            queue.emplace<std::string>(8, '*'); // pushes "********"
            //! [heter_queue put example 1]

            //! [heter_queue example 2]
            auto consume = queue.try_start_consume();
            int  my_int  = consume.element<int>();
            consume.commit();

            consume               = queue.try_start_consume();
            std::string my_string = consume.element<std::string>();
            consume.commit();
            //! [heter_queue example 3
            (void)my_int;
            (void)my_string;
        }

        {
            //! [heter_queue put example 2]
            heter_queue<> queue;
            struct MessageInABottle
            {
                const char * m_text = nullptr;
            };
            auto transaction             = queue.start_emplace<MessageInABottle>();
            transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
            transaction.commit();
            //! [heter_queue put example 2]

            //! [heter_queue consume example 1]
            auto consume = queue.try_start_consume();
            if (consume.complete_type().is<std::string>())
            {
                std::cout << consume.element<std::string>() << std::endl;
            }
            else if (consume.complete_type().is<MessageInABottle>())
            {
                std::cout << consume.element<MessageInABottle>().m_text << std::endl;
            }
            consume.commit();
            //! [heter_queue consume example 1]

            //! [heter_queue iterators example 1]
            heter_queue<> queue_1, queue_2;
            queue_1.push(42);
            assert(queue_1.end() == queue_2.end() && queue_1.end() == heter_queue<>::iterator());

            for (const auto & value : queue_1)
            {
                assert(value.as<int>() == 42);
            }
            //! [heter_queue iterators example 1]
        }

        {
            //! [heter_queue default_construct example 1]
            heter_queue<> queue;
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());
            //! [heter_queue default_construct example 1]
        }
        {
            //! [heter_queue copy_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(queue);
            assert(queue == queue_1);
            //! [heter_queue copy_construct example 1]
        }
        {
            //! [heter_queue move_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(std::move(queue));

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_construct example 1]
        }
        {
            //! [heter_queue construct_copy_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(allocator);
            assert(queue.empty());
            //! [heter_queue construct_copy_alloc example 1]
        }
        {
            //! [heter_queue construct_move_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(std::move(allocator));
            assert(queue.empty());
            //! [heter_queue construct_move_alloc example 1]
        }
        {
            //! [heter_queue copy_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = queue;
            assert(queue == queue_1);
            //! [heter_queue copy_assign example 1]
        }
        {
            //! [heter_queue move_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = std::move(queue);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_assign example 1]
        }
        {
            //! [heter_queue get_allocator example 1]
            heter_queue<> queue;
            assert(queue.get_allocator() == default_allocator());
            //! [heter_queue get_allocator example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 1]
            heter_queue<> queue;
            assert(queue.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 2]
            heter_queue<> queue;
            auto const &  queue_ref = queue;
            assert(queue_ref.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 2]
            (void)queue_ref;
        }
        {
            //! [heter_queue swap example 1]
            heter_queue<> queue, queue_1;
            queue.push(1);
            swap(queue, queue_1);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 1]
        }
        {
            //! [heter_queue swap example 2]
            heter_queue<> queue, queue_1;
            queue.push(1);
            {
                using namespace std;
                swap(queue, queue_1);
            }
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 2]
        }
        {
            //! [heter_queue empty example 1]
            heter_queue<> queue;
            assert(queue.empty());
            queue.push(1);
            assert(!queue.empty());
            //! [heter_queue empty example 1]
        }
        {
            //! [heter_queue clear example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.clear();
            assert(queue.empty());
            //! [heter_queue clear example 1]
        }
        {
            //! [heter_queue pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue pop example 1]
        }
        {
            //! [heter_queue try_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume example 1]
        }
        {
            //! [heter_queue try_start_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::consume_operation consume_1;
            bool const                       bool_1 = queue.try_start_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::consume_operation consume_2;
            auto                             bool_2 = queue.try_start_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }
        {
            heter_queue<> queue;

            //! [heter_queue reentrant example 1]
            // start 3 reentrant put transactions
            auto   put_1 = queue.start_reentrant_push(1);
            auto   put_2 = queue.start_reentrant_emplace<std::string>("Hello world!");
            double pi    = 3.14;
            auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
            assert(
              queue.empty()); // the queue is still empty, because no transaction has been committed

            // commit and start consuming "Hello world!"
            put_2.commit();
            auto consume2 = queue.try_start_reentrant_consume();
            assert(!consume2.empty() && consume2.complete_type().is<std::string>());

            // commit and start consuming 1
            put_1.commit();
            auto consume1 = queue.try_start_reentrant_consume();
            assert(!consume1.empty() && consume1.complete_type().is<int>());

            // cancel 3.14, and commit the consumes
            put_3.cancel();
            consume1.commit();
            consume2.commit();
            assert(queue.empty());

            //! [heter_queue reentrant example 1]
        }
        {
            //! [heter_queue reentrant_pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.reentrant_pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue reentrant_pop example 1]
        }
        {
            //! [heter_queue try_reentrant_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_reentrant_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_reentrant_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_reentrant_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_reentrant_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_reentrant_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_reentrant_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_reentrant_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume example 1]
        }
        {
            //! [heter_queue try_start_reentrant_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::reentrant_consume_operation consume_1;
            bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::reentrant_consume_operation consume_2;
            auto bool_2 = queue.try_start_reentrant_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }

        // this samples uses std::cout and std::cin
        // heterogeneous_queue_samples_1();

        heterogeneous_queue_put_samples();

        heterogeneous_queue_put_transaction_samples();

        heterogeneous_queue_consume_operation_samples();

        heterogeneous_queue_reentrant_put_samples();

        heterogeneous_queue_reentrant_put_transaction_samples();

        heterogeneous_queue_reentrant_consume_operation_samples();
    }